

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O2

Dic<asl::String> * __thiscall
asl::Map<asl::String,_asl::Dic<asl::String>_>::operator[]
          (Map<asl::String,_asl::Dic<asl::String>_> *this,String *key)

{
  int iVar1;
  Dic<asl::String> *pDVar2;
  
  pDVar2 = find(this,key);
  if (Map<asl::String,asl::Dic<asl::String>>::operator[](asl::String_const&)::def == '\0') {
    iVar1 = __cxa_guard_acquire(&Map<asl::String,asl::Dic<asl::String>>::
                                 operator[](asl::String_const&)::def);
    if (iVar1 != 0) {
      Array<asl::Map<asl::String,_asl::String>::KeyVal>::Array
                ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)&operator[]::def);
      __cxa_atexit(Map<asl::String,_asl::String>::~Map,&operator[]::def,&__dso_handle);
      __cxa_guard_release(&Map<asl::String,asl::Dic<asl::String>>::operator[](asl::String_const&)::
                           def);
    }
  }
  if (pDVar2 == (Dic<asl::String> *)0x0) {
    pDVar2 = &operator[]::def;
  }
  return pDVar2;
}

Assistant:

const T& operator[](const K& key) const
	{
		const T* p = find(key);
		static T def = T();
		return p ? *p : def;
	}